

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void ppu_mode3_synchronize(Emulator *e)

{
  byte bVar1;
  TileDataSelect TVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  u16 uVar7;
  ushort uVar8;
  ushort uVar9;
  int iVar10;
  Obj *pOVar11;
  bool bVar12;
  bool bVar13;
  int local_d0;
  Bool local_cc;
  int local_c8;
  int local_c0;
  u8 palette_index_1;
  int end;
  int start;
  int tile_data_offset;
  u8 hi_1;
  u8 lo_1;
  u16 tile_addr_2;
  PaletteRGBA *pal_1;
  u16 tile_index_1;
  u8 oy;
  s8 ox_end;
  s8 ox_start;
  Obj *o;
  int n;
  u8 obj_height;
  u8 palette_index;
  u8 shift;
  u16 tile_addr_1;
  u8 palidx;
  int idx;
  u16 tile_addr;
  u8 attr;
  u8 my7;
  u16 tile_index;
  u16 new_map_addr;
  Bool bg_priority [4];
  Bool bg_is_zero [4];
  uint local_50;
  int i;
  Bool priority;
  u8 hi;
  u8 lo;
  PaletteRGBA *pal;
  RGBA *pRStack_38;
  u16 map_addr;
  RGBA *pixel;
  u16 map_base;
  u8 my;
  u8 mx;
  TileDataSelect data_select;
  int window_counter;
  Bool rendering_window;
  Bool display_obj;
  Bool display_bg;
  u8 y;
  u8 x;
  Emulator *e_local;
  
  display_obj._3_1_ = (e->state).ppu.render_x;
  bVar1 = (e->state).ppu.line_y;
  if (((e->state).ppu.stat.mode == PPU_MODE_MODE3) && ((byte)display_obj._3_1_ < 0xa0)) {
    if (((e->state).is_cgb != FALSE) || (bVar12 = false, (e->state).ppu.lcdc.bg_display != FALSE)) {
      bVar12 = (e->config).disable_bg == FALSE;
    }
    bVar13 = false;
    if ((e->state).ppu.lcdc.obj_display != FALSE) {
      bVar13 = (e->config).disable_obj == FALSE;
    }
    _map_base = 0xff;
    if ((e->state).ppu.rendering_window == FALSE) {
      if (((((e->state).ppu.lcdc.window_display != FALSE) && ((e->config).disable_window == FALSE))
          && ((e->state).ppu.wx < 0xa7)) && ((e->state).ppu.wy <= bVar1)) {
        if ((int)((uint)(e->state).ppu.wx - ((byte)display_obj._3_1_ + 7)) < 0) {
          local_c0 = 0;
        }
        else {
          local_c0 = (uint)(e->state).ppu.wx - ((byte)display_obj._3_1_ + 7);
        }
        _map_base = local_c0;
      }
    }
    else {
      _map_base = 0;
    }
    TVar2 = (e->state).ppu.lcdc.bg_tile_data_select;
    pixel._7_1_ = (e->state).ppu.scx + display_obj._3_1_;
    pixel._6_1_ = (e->state).ppu.scy + bVar1;
    uVar7 = map_select_to_address((e->state).ppu.lcdc.bg_tile_map_select);
    pixel._4_2_ = uVar7 | (ushort)(((int)(uint)pixel._6_1_ >> 3) << 5);
    if ((e->state).sgb.mask == SGB_MASK_CANCEL) {
      pRStack_38 = e->frame_buffer + (int)((uint)bVar1 * 0xa0 + (uint)(byte)display_obj._3_1_);
    }
    else {
      pRStack_38 = ppu_mode3_synchronize::s_dummy_frame_buffer_line;
    }
    pal._6_2_ = 0;
    _priority = (PaletteRGBA *)0x0;
    i._3_1_ = 0;
    i._2_1_ = 0;
    local_50 = 0;
    for (; (e->state).ppu.mode3_render_ticks < (e->state).ticks && (byte)display_obj._3_1_ < 0xa0;
        display_obj._3_1_ = display_obj._3_1_ + 4) {
      bg_priority[2] = TRUE;
      bg_priority[3] = TRUE;
      memset(&tile_addr,0,0x10);
      for (bg_is_zero[3] = FALSE; (int)bg_is_zero[3] < 4; bg_is_zero[3] = bg_is_zero[3] + TRUE) {
        if (_map_base == 0) {
          bVar12 = true;
          (e->state).ppu.rendering_window = TRUE;
          pixel._7_1_ = (display_obj._3_1_ + (char)bg_is_zero[3] + '\a') - (e->state).ppu.wx;
          pixel._6_1_ = (e->state).ppu.win_y;
          uVar7 = map_select_to_address((e->state).ppu.lcdc.window_tile_map_select);
          pixel._4_2_ = uVar7 | (ushort)(((int)(uint)pixel._6_1_ >> 3) << 5);
          pal._6_2_ = 0;
        }
        if (bVar12) {
          uVar8 = pixel._4_2_ | (ushort)((int)(uint)pixel._7_1_ >> 3);
          if (pal._6_2_ == uVar8) {
            i._3_1_ = i._3_1_ << 1;
            i._2_1_ = i._2_1_ << 1;
          }
          else {
            bVar4 = (e->state).vram.data[uVar8];
            idx._0_2_ = (ushort)bVar4;
            palidx = pixel._6_1_ & 7;
            if (TVar2 == TILE_DATA_8800_97FF) {
              idx._0_2_ = (short)(char)bVar4 + 0x100;
            }
            if ((e->state).is_cgb == FALSE) {
              if ((e->state).is_sgb == FALSE) {
                _priority = e->pal;
              }
              else {
                iVar10 = ((int)(uint)bVar1 >> 3) * 0x14 + ((int)(uint)(byte)display_obj._3_1_ >> 3);
                _priority = e->sgb_pal +
                            ((byte)((int)(uint)(e->state).sgb.attr_map[iVar10 >> 2] >>
                                   (('\x03' - ((byte)iVar10 & 3)) * '\x02' & 0x1f)) & 3);
              }
              local_50 = 0;
              uVar9 = ((ushort)idx * 8 + (ushort)palidx) * 2;
              i._3_1_ = (e->state).vram.data[uVar9];
              i._2_1_ = (e->state).vram.data[(int)(uVar9 + 1)];
            }
            else {
              bVar4 = (e->state).vram.data[(int)(uVar8 + 0x2000)];
              _priority = (e->state).ppu.bgcp.palettes + (int)(bVar4 & 7);
              if ((bVar4 & 8) != 0) {
                idx._0_2_ = (ushort)idx + 0x200;
              }
              if ((bVar4 & 0x40) != 0) {
                palidx = '\a' - palidx;
              }
              local_50 = (uint)((bVar4 & 0x80) != 0);
              uVar9 = ((ushort)idx * 8 + (ushort)palidx) * 2;
              i._3_1_ = (e->state).vram.data[uVar9];
              i._2_1_ = (e->state).vram.data[(int)(uVar9 + 1)];
              if ((bVar4 & 0x20) != 0) {
                i._3_1_ = reverse_bits_u8(i._3_1_);
                i._2_1_ = reverse_bits_u8(i._2_1_);
              }
            }
            i._3_1_ = i._3_1_ << (pixel._7_1_ & 7);
            i._2_1_ = i._2_1_ << (pixel._7_1_ & 7);
            pal._6_2_ = uVar8;
          }
          bVar4 = (byte)((int)(uint)i._2_1_ >> 6) & 2 | (byte)((int)(uint)i._3_1_ >> 7);
          pRStack_38[(int)bg_is_zero[3]] = _priority->color[bVar4];
          bg_priority[(long)(int)bg_is_zero[3] + 2] = (uint)(bVar4 == 0);
          *(uint *)(&tile_addr + (long)(int)bg_is_zero[3] * 2) = local_50;
        }
        else if ((e->state).is_cgb == FALSE) {
          if ((e->state).is_sgb == FALSE) {
            pRStack_38[(int)bg_is_zero[3]] = e->color_to_rgba[0].color[0];
          }
          else {
            pRStack_38[(int)bg_is_zero[3]] = e->sgb_pal[0].color[0];
          }
        }
        else {
          pRStack_38[(int)bg_is_zero[3]] = (e->state).ppu.bgcp.palettes[0].color[0];
        }
        pixel._7_1_ = pixel._7_1_ + 1;
        _map_base = _map_base + -1;
      }
      if (((e->state).is_cgb != FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
        memset(bg_priority + 2,1,0x10);
        memset(&tile_addr,0,0x10);
      }
      if (bVar13) {
        bVar4 = s_obj_size_to_height[(e->state).ppu.lcdc.obj_size];
        o._0_4_ = (uint)(e->state).ppu.line_obj_count;
        while (o._0_4_ = (uint)o - 1, -1 < (int)(uint)o) {
          pOVar11 = (e->state).ppu.line_obj + (int)(uint)o;
          bVar5 = pOVar11->x - display_obj._3_1_;
          bVar6 = bVar5 + 7;
          pal_1._5_1_ = bVar1 - pOVar11->y;
          if (((bVar5 < 4) || (bVar6 < 8)) && (pal_1._5_1_ < bVar4)) {
            if (pOVar11->yflip != FALSE) {
              pal_1._5_1_ = (bVar4 - 1) - pal_1._5_1_;
            }
            pal_1._2_2_ = (ushort)pOVar11->tile;
            if (bVar4 == 0x10) {
              if (pal_1._5_1_ < 8) {
                pal_1._2_2_ = pal_1._2_2_ & 0xfe;
              }
              else {
                pal_1._2_2_ = pal_1._2_2_ | 1;
                pal_1._5_1_ = pal_1._5_1_ - 8;
              }
            }
            if ((e->state).is_cgb == FALSE) {
              _tile_data_offset = e->pal + (int)(pOVar11->palette + 1);
            }
            else {
              _tile_data_offset = (e->state).ppu.obcp.palettes + (int)(pOVar11->cgb_palette & 7);
              if (pOVar11->bank != '\0') {
                pal_1._2_2_ = pal_1._2_2_ + 0x200;
              }
            }
            uVar8 = (pal_1._2_2_ * 8 + (pal_1._5_1_ & 7)) * 2;
            start._1_1_ = (e->state).vram.data[uVar8];
            start._0_1_ = (e->state).vram.data[(int)(uVar8 + 1)];
            if (pOVar11->xflip == FALSE) {
              start._1_1_ = reverse_bits_u8(start._1_1_);
              start._0_1_ = reverse_bits_u8((byte)start);
            }
            if ((char)bVar5 < '\x01') {
              local_c8 = -(int)(char)bVar5;
            }
            else {
              local_c8 = 0;
            }
            if ((local_c8 < 0) || (7 < local_c8)) {
              __assert_fail("tile_data_offset >= 0 && tile_data_offset < 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                            ,0xdc6,"void ppu_mode3_synchronize(Emulator *)");
            }
            start._1_1_ = (byte)((int)(uint)start._1_1_ >> ((byte)local_c8 & 0x1f));
            bVar3 = (byte)local_c8 & 0x1f;
            start._0_1_ = (byte)((int)(uint)(byte)start >> bVar3);
            if ((int)(char)bVar5 < 0 >> bVar3) {
              local_cc = 0 >> bVar3;
            }
            else {
              local_cc = (Bool)(char)bVar5;
            }
            if (((int)local_cc < 0) || (3 < (int)local_cc)) {
              __assert_fail("start >= 0 && start < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                            ,0xdcb,"void ppu_mode3_synchronize(Emulator *)");
            }
            if ((char)bVar6 < '\x04') {
              local_d0 = (int)(char)bVar6;
            }
            else {
              local_d0 = 3;
            }
            if ((local_d0 < 0) || (3 < local_d0)) {
              __assert_fail("end >= 0 && end < 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                            ,0xdcd,"void ppu_mode3_synchronize(Emulator *)");
            }
            for (bg_is_zero[3] = local_cc; (int)bg_is_zero[3] <= local_d0;
                bg_is_zero[3] = bg_is_zero[3] + TRUE) {
              bVar5 = ((byte)start & 1) << 1 | start._1_1_ & 1;
              if (((bVar5 != 0) &&
                  ((*(int *)(&tile_addr + (long)(int)bg_is_zero[3] * 2) == 0 ||
                   (bg_priority[(long)(int)bg_is_zero[3] + 2] != FALSE)))) &&
                 ((pOVar11->priority == OBJ_PRIORITY_ABOVE_BG ||
                  (bg_priority[(long)(int)bg_is_zero[3] + 2] != FALSE)))) {
                pRStack_38[(int)bg_is_zero[3]] = _tile_data_offset->color[bVar5];
              }
              start._1_1_ = (byte)((int)(uint)start._1_1_ >> 1);
              start._0_1_ = (byte)((int)(uint)(byte)start >> 1);
            }
          }
        }
      }
      (e->state).ppu.mode3_render_ticks = (e->state).ppu.mode3_render_ticks + 4;
      pRStack_38 = pRStack_38 + 4;
    }
    (e->state).ppu.render_x = display_obj._3_1_;
  }
  return;
}

Assistant:

static void ppu_mode3_synchronize(Emulator* e) {
  u8 x = PPU.render_x;
  const u8 y = PPU.line_y;
  if (STAT.mode != PPU_MODE_MODE3 || x >= SCREEN_WIDTH) return;

  Bool display_bg = (IS_CGB || LCDC.bg_display) && !e->config.disable_bg;
  const Bool display_obj = LCDC.obj_display && !e->config.disable_obj;
  Bool rendering_window = PPU.rendering_window;
  int window_counter = rendering_window ? 0 : 255;
  if (!rendering_window && LCDC.window_display && !e->config.disable_window &&
      PPU.wx <= WINDOW_MAX_X && y >= PPU.wy) {
    window_counter = MAX(0, PPU.wx - (x + WINDOW_X_OFFSET));
  }

  const TileDataSelect data_select = LCDC.bg_tile_data_select;
  u8 mx = PPU.scx + x;
  u8 my = PPU.scy + y;
  u16 map_base = map_select_to_address(LCDC.bg_tile_map_select) |
                 ((my >> 3) * TILE_MAP_WIDTH);
  RGBA* pixel;
  if (SGB.mask != SGB_MASK_CANCEL) {
    static RGBA s_dummy_frame_buffer_line[SCREEN_WIDTH];
    pixel = s_dummy_frame_buffer_line;
  } else {
    pixel = &e->frame_buffer[y * SCREEN_WIDTH + x];
  }

  /* Cache map_addr info. */
  u16 map_addr = 0;
  PaletteRGBA* pal = NULL;
  u8 lo = 0, hi = 0;

  Bool priority = FALSE;
  int i;
  for (; PPU.mode3_render_ticks < TICKS && x < SCREEN_WIDTH;
       PPU.mode3_render_ticks += CPU_TICK, pixel += 4, x += 4) {
    Bool bg_is_zero[4] = {TRUE, TRUE, TRUE, TRUE},
         bg_priority[4] = {FALSE, FALSE, FALSE, FALSE};

    for (i = 0; i < 4; ++i, ++mx) {
      if (UNLIKELY(window_counter-- == 0)) {
        PPU.rendering_window = rendering_window = display_bg = TRUE;
        mx = x + i + WINDOW_X_OFFSET - PPU.wx;
        my = PPU.win_y;
        map_base = map_select_to_address(LCDC.window_tile_map_select) |
                   ((my >> 3) * TILE_MAP_WIDTH);
        map_addr = 0;
      }
      if (display_bg) {
        u16 new_map_addr = map_base | (mx >> 3);
        if (map_addr == new_map_addr) {
          lo <<= 1;
          hi <<= 1;
        } else {
          map_addr = new_map_addr;
          u16 tile_index = VRAM.data[map_addr];
          u8 my7 = my & 7;
          if (data_select == TILE_DATA_8800_97FF) {
            tile_index = 256 + (s8)tile_index;
          }
          if (IS_CGB) {
            u8 attr = VRAM.data[0x2000 + map_addr];
            pal = &PPU.bgcp.palettes[attr & 0x7];
            if (attr & 0x08) { tile_index += 0x200; }
            if (attr & 0x40) { my7 = 7 - my7; }
            priority = (attr & 0x80) != 0;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
            if (attr & 0x20) {
              lo = reverse_bits_u8(lo);
              hi = reverse_bits_u8(hi);
            }
          } else {
            if (IS_SGB) {
              int idx = (y >> 3) * (SCREEN_WIDTH >> 3) + (x >> 3);
              u8 palidx = (SGB.attr_map[idx >> 2] >> (2 * (3 - (idx & 3)))) & 3;
              pal = &e->sgb_pal[palidx];
            } else {
              pal = &e->pal[PALETTE_TYPE_BGP];
            }
            priority = FALSE;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
          }
          u8 shift = mx & 7;
          lo <<= shift;
          hi <<= shift;
        }
        u8 palette_index = ((hi >> 6) & 2) | (lo >> 7);
        pixel[i] = pal->color[palette_index];
        bg_is_zero[i] = palette_index == 0;
        bg_priority[i] = priority;
      } else {
        if (IS_CGB) {
          pixel[i] = PPU.bgcp.palettes[0].color[0];
        } else if (IS_SGB) {
          pixel[i] = e->sgb_pal[0].color[0];
        } else {
          pixel[i] = e->color_to_rgba[0].color[0];
        }
      }
    }

    /* LCDC bit 0 works differently on cgb; when it's cleared OBJ will always
     * have priority over bg and window. */
    if (IS_CGB && !LCDC.bg_display) {
      memset(&bg_is_zero, TRUE, sizeof(bg_is_zero));
      memset(&bg_priority, FALSE, sizeof(bg_priority));
    }

    if (display_obj) {
      u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
      int n;
      for (n = PPU.line_obj_count - 1; n >= 0; --n) {
        Obj* o = &PPU.line_obj[n];
        /* Does [x, x + 4) intersect [o->x, o->x + 8)? Note that the sums must
         * wrap at 256 (i.e. arithmetic is 8-bit). */
        s8 ox_start = o->x - x;
        s8 ox_end = ox_start + 7; /* ox_end is inclusive. */
        u8 oy = y - o->y;
        if (((u8)ox_start >= 4 && (u8)ox_end >= 8) || oy >= obj_height) {
          continue;
        }

        if (o->yflip) {
          oy = obj_height - 1 - oy;
        }

        u16 tile_index = o->tile;
        if (obj_height == 16) {
          if (oy < 8) {
            /* Top tile of 8x16 sprite. */
            tile_index &= 0xfe;
          } else {
            /* Bottom tile of 8x16 sprite. */
            tile_index |= 0x01;
            oy -= 8;
          }
        }
        PaletteRGBA* pal = NULL;
        if (IS_CGB) {
          pal = &PPU.obcp.palettes[o->cgb_palette & 0x7];
          if (o->bank) { tile_index += 0x200; }
        } else {
          pal = &e->pal[o->palette + 1];
        }
        u16 tile_addr = (tile_index * TILE_HEIGHT + (oy & 7)) * TILE_ROW_BYTES;
        u8 lo = VRAM.data[tile_addr];
        u8 hi = VRAM.data[tile_addr + 1];
        if (!o->xflip) {
          lo = reverse_bits_u8(lo);
          hi = reverse_bits_u8(hi);
        }

        int tile_data_offset = MAX(0, -ox_start);
        assert(tile_data_offset >= 0 && tile_data_offset < 8);
        lo >>= tile_data_offset;
        hi >>= tile_data_offset;

        int start = MAX(0, ox_start);
        assert(start >= 0 && start < 4);
        int end = MIN(3, ox_end); /* end is inclusive. */
        assert(end >= 0 && end < 4);
        for (i = start; i <= end; ++i, lo >>= 1, hi >>= 1) {
          u8 palette_index = ((hi & 1) << 1) | (lo & 1);
          if (palette_index != 0 && (!bg_priority[i] || bg_is_zero[i]) &&
              (o->priority == OBJ_PRIORITY_ABOVE_BG || bg_is_zero[i])) {
            pixel[i] = pal->color[palette_index];
          }
        }
      }
    }
  }
  PPU.render_x = x;
}